

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
BoundedFunctionData::Copy(BoundedFunctionData *this)

{
  int32_t iVar1;
  pointer pBVar2;
  long in_RSI;
  templated_unique_single_t copy;
  tuple<BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_> local_20;
  
  local_20.super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
  super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>)
       operator_new(0x10);
  *(undefined8 *)
   local_20.super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>
   .super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_20.
          super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
          super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl + 8) = 0;
  *(undefined ***)
   local_20.super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>
   .super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl = &PTR__FunctionData_00125af0;
  iVar1 = *(int32_t *)(in_RSI + 8);
  pBVar2 = duckdb::unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>::
           operator->((unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>
                       *)&local_20);
  pBVar2->max_val = iVar1;
  *(_Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_> *)this =
       local_20.
       super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
       super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		auto copy = make_uniq<BoundedFunctionData>();
		copy->max_val = max_val;
		return std::move(copy);
	}